

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O2

void init_write_index_block(FFSFile f)

{
  int iVar1;
  FFSIndexType paVar2;
  uchar *puVar3;
  int iVar4;
  
  if (f->read_index == (FFSIndexItem)0x0) {
    iVar1 = (*ffs_file_lseek_func)(f->file_id,0x100,1);
    paVar2 = f->cur_index;
    if (paVar2 == (FFSIndexType)0x0) {
      paVar2 = (FFSIndexType)ffs_malloc(0x20);
      f->cur_index = paVar2;
      (paVar2->write_info).base_file_pos = 0;
      *(int *)((long)paVar2 + 8) = 0;
      *(int *)((long)paVar2 + 0xc) = 0;
      *(int *)((long)paVar2 + 0x10) = 0;
      *(int *)((long)paVar2 + 0x14) = 0;
      (paVar2->write_info).index_block = (uchar *)0x0;
      paVar2 = f->cur_index;
      iVar4 = 0;
    }
    else {
      iVar4 = (paVar2->write_info).data_index_end;
    }
    (paVar2->write_info).base_file_pos = (long)iVar1 + -0x100;
    (f->cur_index->write_info).data_index_start = iVar4;
    (f->cur_index->write_info).data_index_end = (f->cur_index->write_info).data_index_start;
    (f->cur_index->write_info).index_block_size = 0x100;
    paVar2 = f->cur_index;
    if ((paVar2->write_info).index_block == (uchar *)0x0) {
      puVar3 = (uchar *)ffs_malloc(0x100);
      (f->cur_index->write_info).index_block = puVar3;
      memset((f->cur_index->write_info).index_block,0,0x100);
      paVar2 = f->cur_index;
    }
    (paVar2->write_info).next_item_offset = 0x10;
    f->fpos = (long)iVar1;
  }
  else {
    f->read_index = (FFSIndexItem)0x0;
  }
  return;
}

Assistant:

static void
init_write_index_block(FFSFile f)
{
    int data_index_start = 0;
    off_t end_of_index;
    if (f->read_index == NULL) { /* if not append */
	end_of_index = ffs_file_lseek_func(f->file_id, INDEX_BLOCK_SIZE, SEEK_CUR);
	if (f->cur_index) {
	    data_index_start = f->cur_index->write_info.data_index_end;
	} else {
	    f->cur_index = malloc(sizeof(*(f->cur_index)));
	    memset(f->cur_index, 0, sizeof(*(f->cur_index)));
	}
    
	f->cur_index->write_info.base_file_pos = end_of_index - INDEX_BLOCK_SIZE;
	f->cur_index->write_info.data_index_start = data_index_start;
	f->cur_index->write_info.data_index_end = f->cur_index->write_info.data_index_start;
	f->cur_index->write_info.index_block_size = INDEX_BLOCK_SIZE;
	if (!f->cur_index->write_info.index_block) {
	    f->cur_index->write_info.index_block = malloc(INDEX_BLOCK_SIZE);
	    memset(f->cur_index->write_info.index_block, 0, INDEX_BLOCK_SIZE);
	}
	f->cur_index->write_info.next_item_offset = 16;   /* number of bytes written below */
	f->fpos = end_of_index;
    } else {
	f->read_index = NULL;
    }
}